

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  float fVar40;
  float fVar41;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar42 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar67 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_1554;
  RTCIntersectArguments *local_1550;
  ulong local_1548;
  Geometry *local_1540;
  long local_1538;
  long local_1530;
  ulong local_1528;
  ulong local_1520;
  ulong *local_1518;
  RayQueryContext *local_1510;
  Scene *local_1508;
  undefined4 local_1500;
  undefined4 local_14fc;
  undefined4 local_14f8;
  undefined4 local_14f4;
  undefined4 local_14f0;
  undefined4 local_14ec;
  uint local_14e8;
  uint local_14e4;
  uint local_14e0;
  RTCFilterFunctionNArguments local_14d0;
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  byte local_12df;
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  undefined4 uStack_12a4;
  undefined1 local_12a0 [32];
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  ulong local_1200 [570];
  
  local_1200[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200[0] != 8) {
    if (0.0 <= ray->tfar) {
      local_1518 = local_1200 + 1;
      aVar2 = (ray->dir).field_0.field_1;
      auVar26 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar23._8_4_ = 0x7fffffff;
      auVar23._0_8_ = 0x7fffffff7fffffff;
      auVar23._12_4_ = 0x7fffffff;
      auVar23 = vandps_avx512vl((undefined1  [16])aVar2,auVar23);
      auVar47._8_4_ = 0x219392ef;
      auVar47._0_8_ = 0x219392ef219392ef;
      auVar47._12_4_ = 0x219392ef;
      uVar20 = vcmpps_avx512vl(auVar23,auVar47,1);
      bVar3 = (bool)((byte)uVar20 & 1);
      auVar24._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.x;
      bVar3 = (bool)((byte)(uVar20 >> 1) & 1);
      auVar24._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.y;
      bVar3 = (bool)((byte)(uVar20 >> 2) & 1);
      auVar24._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.z;
      bVar3 = (bool)((byte)(uVar20 >> 3) & 1);
      auVar24._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * aVar2.field_3.a;
      auVar23 = vrcp14ps_avx512vl(auVar24);
      auVar25._8_4_ = 0x3f800000;
      auVar25._0_8_ = 0x3f8000003f800000;
      auVar25._12_4_ = 0x3f800000;
      auVar25 = vfnmadd213ps_avx512vl(auVar24,auVar23,auVar25);
      auVar24 = vfmadd132ps_fma(auVar25,auVar23,auVar23);
      auVar27 = vbroadcastss_avx512vl(auVar24);
      auVar56 = ZEXT3264(auVar27);
      auVar23 = vmovshdup_avx(auVar24);
      auVar27 = vbroadcastsd_avx512vl(auVar23);
      auVar57 = ZEXT3264(auVar27);
      auVar25 = vshufpd_avx(auVar24,auVar24,1);
      auVar28._8_4_ = 2;
      auVar28._0_8_ = 0x200000002;
      auVar28._12_4_ = 2;
      auVar28._16_4_ = 2;
      auVar28._20_4_ = 2;
      auVar28._24_4_ = 2;
      auVar28._28_4_ = 2;
      auVar27 = vpermps_avx512vl(auVar28,ZEXT1632(auVar24));
      auVar58 = ZEXT3264(auVar27);
      fVar40 = auVar24._0_4_ * (ray->org).field_0.m128[0];
      auVar38._4_4_ = fVar40;
      auVar38._0_4_ = fVar40;
      auVar38._8_4_ = fVar40;
      auVar38._12_4_ = fVar40;
      auVar38._16_4_ = fVar40;
      auVar38._20_4_ = fVar40;
      auVar38._24_4_ = fVar40;
      auVar38._28_4_ = fVar40;
      auVar27._8_4_ = 1;
      auVar27._0_8_ = 0x100000001;
      auVar27._12_4_ = 1;
      auVar27._16_4_ = 1;
      auVar27._20_4_ = 1;
      auVar27._24_4_ = 1;
      auVar27._28_4_ = 1;
      auVar29 = ZEXT1632(CONCAT412(auVar24._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar24._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar24._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar40))));
      auVar27 = vpermps_avx2(auVar27,auVar29);
      auVar29 = vpermps_avx2(auVar28,auVar29);
      local_1520 = (ulong)(auVar24._0_4_ < 0.0) << 5;
      local_1528 = (ulong)(auVar23._0_4_ < 0.0) << 5 | 0x40;
      uVar20 = (ulong)(auVar25._0_4_ < 0.0) << 5 | 0x80;
      uVar21 = local_1520 ^ 0x20;
      uVar22 = local_1528 ^ 0x20;
      auVar39._8_4_ = 0x80000000;
      auVar39._0_8_ = 0x8000000080000000;
      auVar39._12_4_ = 0x80000000;
      auVar39._16_4_ = 0x80000000;
      auVar39._20_4_ = 0x80000000;
      auVar39._24_4_ = 0x80000000;
      auVar39._28_4_ = 0x80000000;
      auVar28 = vxorps_avx512vl(auVar38,auVar39);
      auVar59 = ZEXT3264(auVar28);
      auVar27 = vxorps_avx512vl(auVar27,auVar39);
      auVar60 = ZEXT3264(auVar27);
      auVar27 = vxorps_avx512vl(auVar29,auVar39);
      auVar61 = ZEXT3264(auVar27);
      auVar27 = vbroadcastss_avx512vl(auVar26);
      auVar62 = ZEXT3264(auVar27);
      auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)ray->tfar));
      auVar63 = ZEXT3264(auVar27);
      auVar27 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar64 = ZEXT3264(auVar27);
      auVar27 = vbroadcastsd_avx512vl(ZEXT816(0x8000000080000000));
      auVar65 = ZEXT3264(auVar27);
      auVar66 = ZEXT3264(_DAT_01fbac00);
      auVar26 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
      auVar67 = ZEXT1664(auVar26);
      local_1510 = context;
LAB_01c68aaf:
      if (local_1518 != local_1200) {
        uVar19 = local_1518[-1];
        local_1518 = local_1518 + -1;
        while ((uVar19 & 8) == 0) {
          auVar27 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar19 + 0x40 + local_1520),auVar59._0_32_,
                               auVar56._0_32_);
          auVar29 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar19 + 0x40 + local_1528),auVar60._0_32_,
                               auVar57._0_32_);
          auVar27 = vpmaxsd_avx2(auVar27,auVar29);
          auVar29 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar19 + 0x40 + uVar20),auVar61._0_32_,
                               auVar58._0_32_);
          auVar29 = vpmaxsd_avx512vl(auVar29,auVar62._0_32_);
          auVar27 = vpmaxsd_avx2(auVar27,auVar29);
          auVar29 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar19 + 0x40 + uVar21),auVar59._0_32_,
                               auVar56._0_32_);
          auVar28 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar19 + 0x40 + uVar22),auVar60._0_32_,
                               auVar57._0_32_);
          auVar29 = vpminsd_avx2(auVar29,auVar28);
          auVar28 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar19 + 0x40 + (uVar20 ^ 0x20)),
                               auVar61._0_32_,auVar58._0_32_);
          auVar28 = vpminsd_avx512vl(auVar28,auVar63._0_32_);
          auVar29 = vpminsd_avx2(auVar29,auVar28);
          uVar18 = vpcmpd_avx512vl(auVar27,auVar29,2);
          if ((char)uVar18 == '\0') goto LAB_01c68aaf;
          uVar15 = uVar19 & 0xfffffffffffffff0;
          lVar10 = 0;
          for (uVar19 = uVar18; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
            lVar10 = lVar10 + 1;
          }
          uVar19 = *(ulong *)(uVar15 + lVar10 * 8);
          uVar17 = (uint)uVar18 - 1 & (uint)uVar18;
          uVar18 = (ulong)uVar17;
          if (uVar17 != 0) {
            do {
              *local_1518 = uVar19;
              local_1518 = local_1518 + 1;
              lVar10 = 0;
              for (uVar19 = uVar18; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                lVar10 = lVar10 + 1;
              }
              uVar18 = uVar18 - 1 & uVar18;
              uVar19 = *(ulong *)(uVar15 + lVar10 * 8);
            } while (uVar18 != 0);
          }
        }
        local_1530 = (ulong)((uint)uVar19 & 0xf) - 8;
        uVar19 = uVar19 & 0xfffffffffffffff0;
        for (local_1538 = 0; local_1538 != local_1530; local_1538 = local_1538 + 1) {
          lVar16 = local_1538 * 0xe0;
          lVar10 = uVar19 + 0xd0 + lVar16;
          local_13a0 = *(undefined8 *)(lVar10 + 0x10);
          uStack_1398 = *(undefined8 *)(lVar10 + 0x18);
          lVar10 = uVar19 + 0xc0 + lVar16;
          local_1380 = *(undefined8 *)(lVar10 + 0x10);
          uStack_1378 = *(undefined8 *)(lVar10 + 0x18);
          uStack_1370 = local_1380;
          uStack_1368 = uStack_1378;
          uStack_1390 = local_13a0;
          uStack_1388 = uStack_1398;
          auVar42._16_16_ = *(undefined1 (*) [16])(uVar19 + 0x60 + lVar16);
          auVar42._0_16_ = *(undefined1 (*) [16])(uVar19 + lVar16);
          auVar48._16_16_ = *(undefined1 (*) [16])(uVar19 + 0x70 + lVar16);
          auVar48._0_16_ = *(undefined1 (*) [16])(uVar19 + 0x10 + lVar16);
          auVar49._16_16_ = *(undefined1 (*) [16])(uVar19 + 0x80 + lVar16);
          auVar49._0_16_ = *(undefined1 (*) [16])(uVar19 + 0x20 + lVar16);
          auVar26 = *(undefined1 (*) [16])(uVar19 + 0x30 + lVar16);
          auVar29._16_16_ = auVar26;
          auVar29._0_16_ = auVar26;
          auVar23 = *(undefined1 (*) [16])(uVar19 + 0x40 + lVar16);
          auVar37._16_16_ = auVar23;
          auVar37._0_16_ = auVar23;
          auVar25 = *(undefined1 (*) [16])(uVar19 + 0x50 + lVar16);
          auVar36._16_16_ = auVar25;
          auVar36._0_16_ = auVar25;
          auVar24 = *(undefined1 (*) [16])(uVar19 + 0x90 + lVar16);
          auVar46._16_16_ = auVar24;
          auVar46._0_16_ = auVar24;
          auVar24 = *(undefined1 (*) [16])(uVar19 + 0xa0 + lVar16);
          auVar50._16_16_ = auVar24;
          auVar50._0_16_ = auVar24;
          auVar24 = *(undefined1 (*) [16])(uVar19 + 0xb0 + lVar16);
          auVar51._16_16_ = auVar24;
          auVar51._0_16_ = auVar24;
          auVar27 = vsubps_avx(auVar42,auVar29);
          auVar29 = vsubps_avx(auVar48,auVar37);
          auVar28 = vsubps_avx(auVar49,auVar36);
          auVar39 = vsubps_avx(auVar46,auVar42);
          auVar38 = vsubps_avx(auVar50,auVar48);
          auVar37 = vsubps_avx(auVar51,auVar49);
          auVar30._4_4_ = auVar29._4_4_ * auVar37._4_4_;
          auVar30._0_4_ = auVar29._0_4_ * auVar37._0_4_;
          auVar30._8_4_ = auVar29._8_4_ * auVar37._8_4_;
          auVar30._12_4_ = auVar29._12_4_ * auVar37._12_4_;
          auVar30._16_4_ = auVar29._16_4_ * auVar37._16_4_;
          auVar30._20_4_ = auVar29._20_4_ * auVar37._20_4_;
          auVar30._24_4_ = auVar29._24_4_ * auVar37._24_4_;
          auVar30._28_4_ = auVar26._12_4_;
          auVar26 = vfmsub231ps_fma(auVar30,auVar38,auVar28);
          auVar34._4_4_ = auVar28._4_4_ * auVar39._4_4_;
          auVar34._0_4_ = auVar28._0_4_ * auVar39._0_4_;
          auVar34._8_4_ = auVar28._8_4_ * auVar39._8_4_;
          auVar34._12_4_ = auVar28._12_4_ * auVar39._12_4_;
          auVar34._16_4_ = auVar28._16_4_ * auVar39._16_4_;
          auVar34._20_4_ = auVar28._20_4_ * auVar39._20_4_;
          auVar34._24_4_ = auVar28._24_4_ * auVar39._24_4_;
          auVar34._28_4_ = auVar23._12_4_;
          auVar23 = vfmsub231ps_fma(auVar34,auVar37,auVar27);
          auVar35._4_4_ = auVar27._4_4_ * auVar38._4_4_;
          auVar35._0_4_ = auVar27._0_4_ * auVar38._0_4_;
          auVar35._8_4_ = auVar27._8_4_ * auVar38._8_4_;
          auVar35._12_4_ = auVar27._12_4_ * auVar38._12_4_;
          auVar35._16_4_ = auVar27._16_4_ * auVar38._16_4_;
          auVar35._20_4_ = auVar27._20_4_ * auVar38._20_4_;
          auVar35._24_4_ = auVar27._24_4_ * auVar38._24_4_;
          auVar35._28_4_ = auVar25._12_4_;
          uVar1 = *(undefined4 *)&(ray->dir).field_0;
          auVar54._4_4_ = uVar1;
          auVar54._0_4_ = uVar1;
          auVar54._8_4_ = uVar1;
          auVar54._12_4_ = uVar1;
          auVar54._16_4_ = uVar1;
          auVar54._20_4_ = uVar1;
          auVar54._24_4_ = uVar1;
          auVar54._28_4_ = uVar1;
          uVar1 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
          auVar55._4_4_ = uVar1;
          auVar55._0_4_ = uVar1;
          auVar55._8_4_ = uVar1;
          auVar55._12_4_ = uVar1;
          auVar55._16_4_ = uVar1;
          auVar55._20_4_ = uVar1;
          auVar55._24_4_ = uVar1;
          auVar55._28_4_ = uVar1;
          auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[2]));
          uVar1 = *(undefined4 *)&(ray->org).field_0;
          auVar31._4_4_ = uVar1;
          auVar31._0_4_ = uVar1;
          auVar31._8_4_ = uVar1;
          auVar31._12_4_ = uVar1;
          auVar31._16_4_ = uVar1;
          auVar31._20_4_ = uVar1;
          auVar31._24_4_ = uVar1;
          auVar31._28_4_ = uVar1;
          auVar31 = vsubps_avx512vl(auVar42,auVar31);
          auVar25 = vfmsub231ps_fma(auVar35,auVar39,auVar29);
          uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar32._4_4_ = uVar1;
          auVar32._0_4_ = uVar1;
          auVar32._8_4_ = uVar1;
          auVar32._12_4_ = uVar1;
          auVar32._16_4_ = uVar1;
          auVar32._20_4_ = uVar1;
          auVar32._24_4_ = uVar1;
          auVar32._28_4_ = uVar1;
          auVar32 = vsubps_avx512vl(auVar48,auVar32);
          uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar33._4_4_ = uVar1;
          auVar33._0_4_ = uVar1;
          auVar33._8_4_ = uVar1;
          auVar33._12_4_ = uVar1;
          auVar33._16_4_ = uVar1;
          auVar33._20_4_ = uVar1;
          auVar33._24_4_ = uVar1;
          auVar33._28_4_ = uVar1;
          auVar33 = vsubps_avx512vl(auVar49,auVar33);
          auVar34 = vmulps_avx512vl(auVar55,auVar33);
          auVar34 = vfmsub231ps_avx512vl(auVar34,auVar32,auVar30);
          auVar35 = vmulps_avx512vl(auVar30,auVar31);
          auVar35 = vfmsub231ps_avx512vl(auVar35,auVar33,auVar54);
          auVar36 = vmulps_avx512vl(auVar54,auVar32);
          auVar36 = vfmsub231ps_avx512vl(auVar36,auVar31,auVar55);
          auVar30 = vmulps_avx512vl(ZEXT1632(auVar25),auVar30);
          auVar30 = vfmadd231ps_avx512vl(auVar30,ZEXT1632(auVar23),auVar55);
          local_1300 = vfmadd231ps_avx512vl(auVar30,ZEXT1632(auVar26),auVar54);
          vandps_avx512vl(local_1300,auVar64._0_32_);
          auVar37 = vmulps_avx512vl(auVar37,auVar36);
          auVar38 = vfmadd231ps_avx512vl(auVar37,auVar35,auVar38);
          auVar39 = vfmadd231ps_avx512vl(auVar38,auVar34,auVar39);
          vandps_avx512vl(local_1300,auVar65._0_32_);
          fVar40 = auVar39._16_4_;
          fVar4 = auVar39._20_4_;
          fVar5 = auVar39._24_4_;
          auVar38 = ZEXT1232(ZEXT812(0));
          auVar28 = vmulps_avx512vl(auVar28,auVar36);
          auVar29 = vfmadd231ps_avx512vl(auVar28,auVar29,auVar35);
          auVar27 = vfmadd231ps_avx512vl(auVar29,auVar27,auVar34);
          auVar52._0_4_ = (float)(auVar39._0_4_ ^ auVar27._0_4_);
          auVar52._4_4_ = (float)(auVar39._4_4_ ^ auVar27._4_4_);
          auVar52._8_4_ = (float)(auVar39._8_4_ ^ auVar27._8_4_);
          auVar52._12_4_ = (float)(auVar39._12_4_ ^ auVar27._12_4_);
          auVar52._16_4_ = (float)((uint)fVar40 ^ auVar27._16_4_);
          auVar52._20_4_ = (float)((uint)fVar4 ^ auVar27._20_4_);
          auVar52._24_4_ = (float)((uint)fVar5 ^ auVar27._24_4_);
          auVar52._28_4_ = (float)(auVar39._28_4_ ^ auVar27._28_4_);
          auVar27 = auVar67._0_32_;
          uVar6 = vcmpps_avx512vl(auVar38,auVar27,5);
          uVar7 = vcmpps_avx512vl(auVar52,auVar27,5);
          uVar8 = vcmpps_avx512vl(local_1300,auVar27,4);
          auVar53._0_4_ = auVar52._0_4_ + 0.0;
          auVar53._4_4_ = auVar52._4_4_ + 0.0;
          auVar53._8_4_ = auVar52._8_4_ + 0.0;
          auVar53._12_4_ = auVar52._12_4_ + 0.0;
          auVar53._16_4_ = auVar52._16_4_ + 0.0;
          auVar53._20_4_ = auVar52._20_4_ + 0.0;
          auVar53._24_4_ = auVar52._24_4_ + 0.0;
          auVar53._28_4_ = auVar52._28_4_ + 0.0;
          uVar9 = vcmpps_avx512vl(auVar53,local_1300,2);
          local_12df = (byte)uVar6 & (byte)uVar7 & (byte)uVar8 & (byte)uVar9;
          if (local_12df != 0) {
            auVar14._4_4_ = auVar25._4_4_ * auVar33._4_4_;
            auVar14._0_4_ = auVar25._0_4_ * auVar33._0_4_;
            auVar14._8_4_ = auVar25._8_4_ * auVar33._8_4_;
            auVar14._12_4_ = auVar25._12_4_ * auVar33._12_4_;
            auVar14._16_4_ = auVar33._16_4_ * 0.0;
            auVar14._20_4_ = auVar33._20_4_ * 0.0;
            auVar14._24_4_ = auVar33._24_4_ * 0.0;
            auVar14._28_4_ = auVar33._28_4_;
            auVar24 = vfmadd213ps_fma(auVar32,ZEXT1632(auVar23),auVar14);
            auVar24 = vfmadd213ps_fma(auVar31,ZEXT1632(auVar26),ZEXT1632(auVar24));
            local_1320._0_4_ = (float)(auVar39._0_4_ ^ auVar24._0_4_);
            local_1320._4_4_ = (float)(auVar39._4_4_ ^ auVar24._4_4_);
            local_1320._8_4_ = (float)(auVar39._8_4_ ^ auVar24._8_4_);
            local_1320._12_4_ = (float)(auVar39._12_4_ ^ auVar24._12_4_);
            local_1320._16_4_ = fVar40;
            local_1320._20_4_ = fVar4;
            local_1320._24_4_ = fVar5;
            local_1320._28_4_ = auVar39._28_4_;
            uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
            auVar11._4_4_ = uVar1;
            auVar11._0_4_ = uVar1;
            auVar11._8_4_ = uVar1;
            auVar11._12_4_ = uVar1;
            auVar11._16_4_ = uVar1;
            auVar11._20_4_ = uVar1;
            auVar11._24_4_ = uVar1;
            auVar11._28_4_ = uVar1;
            auVar27 = vmulps_avx512vl(local_1300,auVar11);
            uVar6 = vcmpps_avx512vl(auVar27,local_1320,1);
            fVar41 = ray->tfar;
            auVar12._4_4_ = fVar41;
            auVar12._0_4_ = fVar41;
            auVar12._8_4_ = fVar41;
            auVar12._12_4_ = fVar41;
            auVar12._16_4_ = fVar41;
            auVar12._20_4_ = fVar41;
            auVar12._24_4_ = fVar41;
            auVar12._28_4_ = fVar41;
            auVar27 = vmulps_avx512vl(local_1300,auVar12);
            uVar7 = vcmpps_avx512vl(local_1320,auVar27,2);
            local_12df = (byte)uVar6 & (byte)uVar7 & local_12df;
            if (local_12df != 0) {
              auVar27 = vsubps_avx(local_1300,auVar52);
              local_1360 = vblendps_avx(auVar38,auVar27,0xf0);
              auVar27 = vsubps_avx(local_1300,auVar38);
              local_1340 = vblendps_avx(auVar52,auVar27,0xf0);
              auVar27 = auVar66._0_32_;
              local_1260 = vmulps_avx512vl(ZEXT1632(auVar26),auVar27);
              local_1240 = vmulps_avx512vl(ZEXT1632(auVar23),auVar27);
              local_1220 = vmulps_avx512vl(ZEXT1632(auVar25),auVar27);
              local_1508 = local_1510->scene;
              auVar27 = vrcp14ps_avx512vl(local_1300);
              auVar13._8_4_ = 0x3f800000;
              auVar13._0_8_ = 0x3f8000003f800000;
              auVar13._12_4_ = 0x3f800000;
              auVar13._16_4_ = 0x3f800000;
              auVar13._20_4_ = 0x3f800000;
              auVar13._24_4_ = 0x3f800000;
              auVar13._28_4_ = 0x3f800000;
              auVar29 = vfnmadd213ps_avx512vl(local_1300,auVar27,auVar13);
              auVar26 = vfmadd132ps_fma(auVar29,auVar27,auVar27);
              fVar41 = auVar26._0_4_;
              fVar43 = auVar26._4_4_;
              fVar44 = auVar26._8_4_;
              fVar45 = auVar26._12_4_;
              uStack_1264 = auVar27._28_4_;
              local_1280[0] = fVar41 * local_1320._0_4_;
              local_1280[1] = fVar43 * local_1320._4_4_;
              local_1280[2] = fVar44 * local_1320._8_4_;
              local_1280[3] = fVar45 * local_1320._12_4_;
              fStack_1270 = fVar40 * 0.0;
              fStack_126c = fVar4 * 0.0;
              fStack_1268 = fVar5 * 0.0;
              local_12c0[0] = local_1360._0_4_ * fVar41;
              local_12c0[1] = local_1360._4_4_ * fVar43;
              local_12c0[2] = local_1360._8_4_ * fVar44;
              local_12c0[3] = local_1360._12_4_ * fVar45;
              fStack_12b0 = local_1360._16_4_ * 0.0;
              fStack_12ac = local_1360._20_4_ * 0.0;
              fStack_12a8 = local_1360._24_4_ * 0.0;
              uStack_12a4 = uStack_1264;
              local_12a0._4_4_ = local_1340._4_4_ * fVar43;
              local_12a0._0_4_ = local_1340._0_4_ * fVar41;
              local_12a0._8_4_ = local_1340._8_4_ * fVar44;
              local_12a0._12_4_ = local_1340._12_4_ * fVar45;
              local_12a0._16_4_ = local_1340._16_4_ * 0.0;
              local_12a0._20_4_ = local_1340._20_4_ * 0.0;
              local_12a0._24_4_ = local_1340._24_4_ * 0.0;
              local_12a0._28_4_ = uStack_1264;
              local_1548 = (ulong)local_12df;
              do {
                auVar26 = auVar67._0_16_;
                uVar18 = 0;
                for (uVar15 = local_1548; (uVar15 & 1) == 0;
                    uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                  uVar18 = uVar18 + 1;
                }
                local_14e8 = *(uint *)((long)&local_1380 + uVar18 * 4);
                local_1540 = (local_1508->geometries).items[local_14e8].ptr;
                if ((local_1540->mask & ray->mask) == 0) {
                  local_1548 = local_1548 ^ 1L << (uVar18 & 0x3f);
                }
                else {
                  if ((local_1510->args->filter == (RTCFilterFunctionN)0x0) &&
                     (local_1540->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01c69138:
                    ray->tfar = -INFINITY;
                    return;
                  }
                  local_1550 = local_1510->args;
                  local_14a0 = auVar63._0_32_;
                  local_1480 = auVar62._0_32_;
                  local_1460 = auVar61._0_32_;
                  local_1440 = auVar60._0_32_;
                  local_1420 = auVar59._0_32_;
                  local_1400 = auVar58._0_32_;
                  local_13e0 = auVar57._0_32_;
                  local_13c0 = auVar56._0_32_;
                  uVar15 = (ulong)(uint)((int)uVar18 * 4);
                  local_14d0.context = local_1510->user;
                  local_1500 = *(undefined4 *)(local_1260 + uVar15);
                  local_14fc = *(undefined4 *)(local_1240 + uVar15);
                  local_14f8 = *(undefined4 *)(local_1220 + uVar15);
                  local_14f4 = *(undefined4 *)((long)local_12c0 + uVar15);
                  local_14f0 = *(undefined4 *)(local_12a0 + uVar15);
                  local_14ec = *(undefined4 *)((long)&local_13a0 + uVar15);
                  local_14e4 = (local_14d0.context)->instID[0];
                  local_14e0 = (local_14d0.context)->instPrimID[0];
                  fVar40 = ray->tfar;
                  ray->tfar = *(float *)((long)local_1280 + uVar15);
                  local_1554 = -1;
                  local_14d0.valid = &local_1554;
                  local_14d0.geometryUserPtr = local_1540->userPtr;
                  local_14d0.hit = (RTCHitN *)&local_1500;
                  local_14d0.N = 1;
                  local_14d0.ray = (RTCRayN *)ray;
                  if (((local_1540->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                      ((*local_1540->occlusionFilterN)(&local_14d0), *local_14d0.valid != 0)) &&
                     ((local_1550->filter == (RTCFilterFunctionN)0x0 ||
                      ((((local_1550->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT &&
                        (((local_1540->field_8).field_0x2 & 0x40) == 0)) ||
                       ((*local_1550->filter)(&local_14d0), *local_14d0.valid != 0))))))
                  goto LAB_01c69138;
                  ray->tfar = fVar40;
                  local_1548 = local_1548 ^ 1L << (uVar18 & 0x3f);
                  auVar56 = ZEXT3264(local_13c0);
                  auVar57 = ZEXT3264(local_13e0);
                  auVar58 = ZEXT3264(local_1400);
                  auVar59 = ZEXT3264(local_1420);
                  auVar60 = ZEXT3264(local_1440);
                  auVar61 = ZEXT3264(local_1460);
                  auVar62 = ZEXT3264(local_1480);
                  auVar63 = ZEXT3264(local_14a0);
                  auVar27 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar64 = ZEXT3264(auVar27);
                  auVar27 = vbroadcastsd_avx512vl(ZEXT816(0x8000000080000000));
                  auVar65 = ZEXT3264(auVar27);
                  auVar66 = ZEXT3264(_DAT_01fbac00);
                  auVar26 = vxorps_avx512vl(auVar26,auVar26);
                  auVar67 = ZEXT1664(auVar26);
                }
              } while (local_1548 != 0);
            }
          }
        }
        goto LAB_01c68aaf;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }